

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::enum_<kratos::IRNodeKind>::enum_<>
          (enum_<kratos::IRNodeKind> *this,handle *scope,char *name)

{
  name local_70;
  is_method local_68;
  arg local_60;
  accessor<pybind11::detail::accessor_policies::str_attr> local_50;
  cpp_function local_30;
  type local_22;
  is_new_style_constructor local_21;
  
  class_<kratos::IRNodeKind>::class_<>
            (&this->super_class_<kratos::IRNodeKind>,(handle)scope->m_ptr,name);
  (this->m_base).m_base.m_ptr =
       (this->super_class_<kratos::IRNodeKind>).super_generic_type.super_object.super_handle.m_ptr;
  (this->m_base).m_parent.m_ptr = scope->m_ptr;
  pybind11::detail::enum_base::init(&this->m_base,(EVP_PKEY_CTX *)0x0);
  local_50._0_8_ = "value";
  local_50.obj.m_ptr._0_1_ = 2;
  pybind11::detail::initimpl::
  factory<pybind11::enum_<kratos::IRNodeKind>::enum_<>(pybind11::handle_const&,char_const*)::{lambda(unsigned_int)#1},pybind11::detail::void_type(*)(),kratos::IRNodeKind(unsigned_int),pybind11::detail::void_type()>
  ::execute<pybind11::class_<kratos::IRNodeKind>,pybind11::arg>
            ((factory<pybind11::enum_<kratos::IRNodeKind>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(unsigned_int)_1_,pybind11::detail::void_type(*)(),kratos::IRNodeKind(unsigned_int),pybind11::detail::void_type()>
              *)&local_60,&this->super_class_<kratos::IRNodeKind>,(arg *)&local_50);
  class_<kratos::IRNodeKind>::
  def_property_readonly<pybind11::enum_<kratos::IRNodeKind>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(kratos::IRNodeKind)_1_>
            (&this->super_class_<kratos::IRNodeKind>,"value",(anon_class_1_0_00000001 *)&local_50);
  class_<kratos::IRNodeKind>::
  def<pybind11::enum_<kratos::IRNodeKind>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(kratos::IRNodeKind)_2_>
            (&this->super_class_<kratos::IRNodeKind>,"__int__",(type *)&local_50);
  class_<kratos::IRNodeKind>::
  def<pybind11::enum_<kratos::IRNodeKind>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(kratos::IRNodeKind)_3_>
            (&this->super_class_<kratos::IRNodeKind>,"__index__",(type *)&local_50);
  local_70.value = "__setstate__";
  local_68.class_.m_ptr =
       (handle)(this->super_class_<kratos::IRNodeKind>).super_generic_type.super_object.super_handle
               .m_ptr;
  local_60.name = "state";
  local_60._8_1_ = 2;
  cpp_function::
  cpp_function<pybind11::enum_<kratos::IRNodeKind>::enum_<>(pybind11::handle_const&,char_const*)::_lambda(pybind11::detail::value_and_holder&,unsigned_int)_1_,pybind11::detail::is_new_style_constructor,pybind11::name,pybind11::is_method,pybind11::arg,void>
            (&local_30,&local_22,&local_21,&local_70,&local_68,&local_60);
  local_50.obj.m_ptr =
       (this->super_class_<kratos::IRNodeKind>).super_generic_type.super_object.super_handle.m_ptr;
  local_50.key = "__setstate__";
  local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
  pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>::operator=
            (&local_50,&local_30);
  object::~object(&local_50.cache);
  object::~object((object *)&local_30);
  return;
}

Assistant:

enum_(const handle &scope, const char *name, const Extra&... extra)
      : class_<Type>(scope, name, extra...), m_base(*this, scope) {
        constexpr bool is_arithmetic = detail::any_of<std::is_same<arithmetic, Extra>...>::value;
        constexpr bool is_convertible = std::is_convertible<Type, Underlying>::value;
        m_base.init(is_arithmetic, is_convertible);

        def(init([](Scalar i) { return static_cast<Type>(i); }), arg("value"));
        def_property_readonly("value", [](Type value) { return (Scalar) value; });
        def("__int__", [](Type value) { return (Scalar) value; });
        #if PY_MAJOR_VERSION < 3
            def("__long__", [](Type value) { return (Scalar) value; });
        #endif
        #if PY_MAJOR_VERSION > 3 || (PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION >= 8)
            def("__index__", [](Type value) { return (Scalar) value; });
        #endif

        attr("__setstate__") = cpp_function(
            [](detail::value_and_holder &v_h, Scalar arg) {
                detail::initimpl::setstate<Base>(v_h, static_cast<Type>(arg),
                        Py_TYPE(v_h.inst) != v_h.type->type); },
            detail::is_new_style_constructor(),
            pybind11::name("__setstate__"), is_method(*this), arg("state"));
    }